

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O0

_Bool ra_range_uint32_array(roaring_array_t *ra,size_t offset,size_t limit,uint32_t *ans)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  void *in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  int *in_RDI;
  uint32_t *append_ans;
  container_t *c;
  int i;
  size_t cur_len;
  uint32_t *t_ans;
  size_t first_skip;
  _Bool first;
  size_t t_limit;
  size_t dtr;
  size_t ctr;
  uint32_t in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  uint8_t typecode;
  uint32_t *in_stack_ffffffffffffff88;
  int local_64;
  ulong local_60;
  uint32_t *local_58;
  long local_50;
  long local_40;
  long local_38;
  ulong local_30;
  
  local_30 = 0;
  local_38 = 0;
  local_40 = 0;
  bVar2 = false;
  local_50 = 0;
  local_58 = (uint32_t *)0x0;
  local_60 = 0;
  for (local_64 = 0; local_64 < *in_RDI; local_64 = local_64 + 1) {
    piVar5 = (int *)container_unwrap_shared
                              (*(container_t **)(*(long *)(in_RDI + 2) + (long)local_64 * 8),
                               (uint8_t *)(*(long *)(in_RDI + 6) + (long)local_64));
    uVar3 = (uint)*(byte *)(*(long *)(in_RDI + 6) + (long)local_64);
    if (uVar3 == 1) {
      local_40 = (long)*piVar5;
    }
    else if (uVar3 == 2) {
      local_40 = (long)*piVar5;
    }
    else if (uVar3 == 3) {
      iVar4 = run_container_cardinality
                        ((run_container_t *)
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      local_40 = (long)iVar4;
    }
    if ((in_RSI <= (local_30 + local_40) - 1) && (local_30 < in_RSI + in_RDX)) {
      if (!bVar2) {
        local_50 = in_RSI - local_30;
        bVar2 = true;
        local_58 = (uint32_t *)roaring_malloc(0x112f63);
        if (local_58 == (uint32_t *)0x0) {
          return false;
        }
        memset(local_58,0,(local_50 + in_RDX) * 4);
        local_60 = local_50 + in_RDX;
      }
      if (local_60 < (ulong)(local_38 + local_40)) {
        in_stack_ffffffffffffff88 = (uint32_t *)roaring_malloc(0x112fce);
        if (in_stack_ffffffffffffff88 == (uint32_t *)0x0) {
          if (local_58 != (uint32_t *)0x0) {
            roaring_free((void *)0x112fed);
          }
          return false;
        }
        memset(in_stack_ffffffffffffff88,0,(local_60 + local_40) * 4);
        local_60 = local_60 + local_40;
        memcpy(in_stack_ffffffffffffff88,local_58,local_38 << 2);
        roaring_free((void *)0x113045);
        local_58 = in_stack_ffffffffffffff88;
      }
      cVar1 = *(char *)(*(long *)(in_RDI + 6) + (long)local_64);
      typecode = (uint8_t)((uint)in_stack_ffffffffffffff7c >> 0x18);
      if (cVar1 == '\x01') {
        container_to_uint32_array
                  (in_stack_ffffffffffffff88,(container_t *)CONCAT44(uVar3,1),typecode,
                   in_stack_ffffffffffffff78);
      }
      else if (cVar1 == '\x02') {
        container_to_uint32_array
                  (in_stack_ffffffffffffff88,(container_t *)CONCAT44(uVar3,2),typecode,
                   in_stack_ffffffffffffff78);
      }
      else if (cVar1 == '\x03') {
        container_to_uint32_array
                  (in_stack_ffffffffffffff88,(container_t *)CONCAT44(uVar3,3),typecode,
                   in_stack_ffffffffffffff78);
      }
      local_38 = local_40 + local_38;
    }
    local_30 = local_40 + local_30;
    if (in_RDX <= (ulong)(local_38 - local_50)) break;
  }
  if (local_58 != (uint32_t *)0x0) {
    memcpy(in_RCX,local_58 + local_50,in_RDX << 2);
    free(local_58);
  }
  return true;
}

Assistant:

bool ra_range_uint32_array(const roaring_array_t *ra, size_t offset,
                           size_t limit, uint32_t *ans) {
    size_t ctr = 0;
    size_t dtr = 0;

    size_t t_limit = 0;

    bool first = false;
    size_t first_skip = 0;

    uint32_t *t_ans = NULL;
    size_t cur_len = 0;

    for (int i = 0; i < ra->size; ++i) {
        const container_t *c =
            container_unwrap_shared(ra->containers[i], &ra->typecodes[i]);
        switch (ra->typecodes[i]) {
            case BITSET_CONTAINER_TYPE:
                t_limit = (const_CAST_bitset(c))->cardinality;
                break;
            case ARRAY_CONTAINER_TYPE:
                t_limit = (const_CAST_array(c))->cardinality;
                break;
            case RUN_CONTAINER_TYPE:
                t_limit = run_container_cardinality(const_CAST_run(c));
                break;
        }
        if (ctr + t_limit - 1 >= offset && ctr < offset + limit) {
            if (!first) {
                // first_skip = t_limit - (ctr + t_limit - offset);
                first_skip = offset - ctr;
                first = true;
                t_ans = (uint32_t *)roaring_malloc(sizeof(*t_ans) *
                                                   (first_skip + limit));
                if (t_ans == NULL) {
                    return false;
                }
                memset(t_ans, 0, sizeof(*t_ans) * (first_skip + limit));
                cur_len = first_skip + limit;
            }
            if (dtr + t_limit > cur_len) {
                uint32_t *append_ans = (uint32_t *)roaring_malloc(
                    sizeof(*append_ans) * (cur_len + t_limit));
                if (append_ans == NULL) {
                    if (t_ans != NULL) roaring_free(t_ans);
                    return false;
                }
                memset(append_ans, 0,
                       sizeof(*append_ans) * (cur_len + t_limit));
                cur_len = cur_len + t_limit;
                memcpy(append_ans, t_ans, dtr * sizeof(uint32_t));
                roaring_free(t_ans);
                t_ans = append_ans;
            }
            switch (ra->typecodes[i]) {
                case BITSET_CONTAINER_TYPE:
                    container_to_uint32_array(t_ans + dtr, const_CAST_bitset(c),
                                              ra->typecodes[i],
                                              ((uint32_t)ra->keys[i]) << 16);
                    break;
                case ARRAY_CONTAINER_TYPE:
                    container_to_uint32_array(t_ans + dtr, const_CAST_array(c),
                                              ra->typecodes[i],
                                              ((uint32_t)ra->keys[i]) << 16);
                    break;
                case RUN_CONTAINER_TYPE:
                    container_to_uint32_array(t_ans + dtr, const_CAST_run(c),
                                              ra->typecodes[i],
                                              ((uint32_t)ra->keys[i]) << 16);
                    break;
            }
            dtr += t_limit;
        }
        ctr += t_limit;
        if (dtr - first_skip >= limit) break;
    }
    if (t_ans != NULL) {
        memcpy(ans, t_ans + first_skip, limit * sizeof(uint32_t));
        free(t_ans);
    }
    return true;
}